

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkValidator.cpp
# Opt level: O3

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::
validateNeuralNetwork<CoreML::Specification::NeuralNetworkClassifier>
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,
          NeuralNetworkClassifier *nn)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  *this_00;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  uint32 uVar3;
  Rep *pRVar4;
  NeuralNetworkLayer *layer;
  Tensor *pTVar5;
  key_type *pkVar6;
  _Base_ptr p_Var7;
  string *psVar8;
  pointer pcVar9;
  NeuralNetworkSpecValidator *pNVar10;
  bool bVar11;
  long lVar12;
  Type *pTVar13;
  iterator iVar14;
  uint32 *puVar15;
  iterator iVar16;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *this_01;
  mapped_type *pmVar17;
  long *plVar18;
  undefined8 *puVar19;
  void **ppvVar20;
  ulong *puVar21;
  size_type *psVar22;
  ulong uVar23;
  int iVar24;
  long lVar25;
  string err;
  string err_7;
  Result r;
  ulong *local_1d0;
  long local_1c8;
  ulong local_1c0;
  undefined8 uStack_1b8;
  undefined1 local_1b0 [8];
  _Alloc_hider local_1a8;
  undefined1 local_1a0 [24];
  string local_188;
  Result *local_168;
  ulong *local_160;
  long local_158;
  ulong local_150;
  long lStack_148;
  ulong *local_140;
  long local_138;
  ulong local_130;
  undefined4 uStack_128;
  undefined4 uStack_124;
  long *local_120;
  undefined8 local_118;
  long local_110;
  undefined8 uStack_108;
  size_type *local_100;
  _Alloc_hider local_f8;
  size_type local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *local_d8;
  ulong *local_d0;
  long local_c8;
  ulong local_c0;
  long lStack_b8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *local_b0;
  void **local_a8;
  ulong *local_a0;
  long local_98;
  ulong local_90 [2];
  NeuralNetworkSpecValidator *local_80;
  _Base_ptr local_78;
  _Base_ptr local_70;
  _Base_ptr local_68;
  void **local_60;
  void **local_58;
  long *local_50 [2];
  long local_40 [2];
  
  local_168 = __return_storage_ptr__;
  Result::Result((Result *)&local_100);
  pRVar4 = (nn->layers_).super_RepeatedPtrFieldBase.rep_;
  ppvVar20 = pRVar4->elements;
  if (pRVar4 == (Rep *)0x0) {
    ppvVar20 = (void **)0x0;
  }
  lVar12 = (long)(nn->layers_).super_RepeatedPtrFieldBase.current_size_;
  if (lVar12 != 0) {
    local_60 = ppvVar20 + lVar12;
    local_b0 = &this->ModelIOBlobNameToRank;
    local_70 = &(this->ModelIOBlobNameToRank)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_d8 = &this->blobNameToRank;
    local_78 = &(this->blobNameToRank)._M_t._M_impl.super__Rb_tree_header._M_header;
    this_00 = &this->blobs;
    local_68 = &(this->blobs)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_80 = this;
    do {
      pNVar10 = local_80;
      layer = (NeuralNetworkLayer *)*ppvVar20;
      local_58 = ppvVar20;
      bVar11 = Result::good((Result *)&local_100);
      if (!bVar11) {
LAB_004e5cfd:
        *(size_type **)local_168 = local_100;
        paVar2 = &(local_168->m_message).field_2;
        (local_168->m_message)._M_dataplus._M_p = (pointer)paVar2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_p == &local_e8) {
          paVar2->_M_allocated_capacity =
               CONCAT71(local_e8._M_allocated_capacity._1_7_,local_e8._M_local_buf[0]);
          *(undefined8 *)((long)&(local_168->m_message).field_2 + 8) = local_e8._8_8_;
        }
        else {
          (local_168->m_message)._M_dataplus._M_p = local_f8._M_p;
          (local_168->m_message).field_2._M_allocated_capacity =
               CONCAT71(local_e8._M_allocated_capacity._1_7_,local_e8._M_local_buf[0]);
        }
        (local_168->m_message)._M_string_length = local_f0;
        local_f0 = 0;
        local_e8._M_local_buf[0] = '\0';
        local_f8._M_p = (pointer)&local_e8;
        goto LAB_004e61d3;
      }
      if (pNVar10->ndArrayInterpretation == true) {
        iVar24 = (layer->inputtensor_).super_RepeatedPtrFieldBase.current_size_;
        if ((long)iVar24 != 0) {
          if ((layer->input_).super_RepeatedPtrFieldBase.current_size_ == iVar24) {
            pRVar4 = (layer->inputtensor_).super_RepeatedPtrFieldBase.rep_;
            local_a8 = pRVar4->elements;
            if (pRVar4 == (Rep *)0x0) {
              local_a8 = (void **)0x0;
            }
            pRVar1 = &layer->input_;
            lVar12 = (long)iVar24 << 3;
            lVar25 = 0;
            do {
              pTVar5 = (Tensor *)local_a8[lVar25];
              validateTensorMessage((Result *)local_1b0,pTVar5,layer);
              local_100 = (size_type *)local_1b0;
              std::__cxx11::string::operator=((string *)&local_f8,(string *)&local_1a8);
              if (local_1a8._M_p != local_1a0 + 8) {
                operator_delete(local_1a8._M_p,local_1a0._8_8_ + 1);
              }
              bVar11 = Result::good((Result *)&local_100);
              if (!bVar11) goto LAB_004e5cfd;
              iVar24 = (int)lVar25;
              pTVar13 = google::protobuf::internal::RepeatedPtrFieldBase::
                        Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                                  (&pRVar1->super_RepeatedPtrFieldBase,iVar24);
              iVar14 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                       ::find(&local_b0->_M_t,pTVar13);
              if (iVar14._M_node != local_70) {
                uVar3 = pTVar5->rank_;
                pTVar13 = google::protobuf::internal::RepeatedPtrFieldBase::
                          Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                                    (&pRVar1->super_RepeatedPtrFieldBase,iVar24);
                puVar15 = (uint32 *)
                          std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                          ::operator[](local_b0,pTVar13);
                if (uVar3 != *puVar15) {
                  psVar8 = (layer->name_).ptr_;
                  pcVar9 = (psVar8->_M_dataplus)._M_p;
                  local_140 = &local_130;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_140,pcVar9,pcVar9 + psVar8->_M_string_length);
                  puVar19 = (undefined8 *)
                            std::__cxx11::string::replace((ulong)&local_140,0,(char *)0x0,0x6144ab);
                  plVar18 = puVar19 + 2;
                  if ((long *)*puVar19 == plVar18) {
                    local_110 = *plVar18;
                    uStack_108 = puVar19[3];
                    local_120 = &local_110;
                  }
                  else {
                    local_110 = *plVar18;
                    local_120 = (long *)*puVar19;
                  }
                  local_118 = puVar19[1];
                  *puVar19 = plVar18;
                  puVar19[1] = 0;
                  *(undefined1 *)(puVar19 + 2) = 0;
                  plVar18 = (long *)std::__cxx11::string::append((char *)&local_120);
                  puVar21 = (ulong *)(plVar18 + 2);
                  if ((ulong *)*plVar18 == puVar21) {
                    local_150 = *puVar21;
                    lStack_148 = plVar18[3];
                    local_160 = &local_150;
                  }
                  else {
                    local_150 = *puVar21;
                    local_160 = (ulong *)*plVar18;
                  }
                  local_158 = plVar18[1];
                  *plVar18 = (long)puVar21;
                  plVar18[1] = 0;
                  *(undefined1 *)(plVar18 + 2) = 0;
                  pTVar13 = google::protobuf::internal::RepeatedPtrFieldBase::
                            Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                                      (&pRVar1->super_RepeatedPtrFieldBase,iVar24);
                  pcVar9 = (pTVar13->_M_dataplus)._M_p;
                  local_d0 = &local_c0;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_d0,pcVar9,pcVar9 + pTVar13->_M_string_length);
                  uVar23 = 0xf;
                  if (local_160 != &local_150) {
                    uVar23 = local_150;
                  }
                  if (uVar23 < (ulong)(local_c8 + local_158)) {
                    uVar23 = 0xf;
                    if (local_d0 != &local_c0) {
                      uVar23 = local_c0;
                    }
                    if (uVar23 < (ulong)(local_c8 + local_158)) goto LAB_004e679c;
                    puVar19 = (undefined8 *)
                              std::__cxx11::string::replace
                                        ((ulong)&local_d0,0,(char *)0x0,(ulong)local_160);
                  }
                  else {
LAB_004e679c:
                    puVar19 = (undefined8 *)
                              std::__cxx11::string::_M_append((char *)&local_160,(ulong)local_d0);
                  }
                  local_1d0 = &local_1c0;
                  puVar21 = puVar19 + 2;
                  if ((ulong *)*puVar19 == puVar21) {
                    local_1c0 = *puVar21;
                    uStack_1b8 = puVar19[3];
                  }
                  else {
                    local_1c0 = *puVar21;
                    local_1d0 = (ulong *)*puVar19;
                  }
                  local_1c8 = puVar19[1];
                  *puVar19 = puVar21;
                  puVar19[1] = 0;
                  *(undefined1 *)puVar21 = 0;
                  puVar19 = (undefined8 *)std::__cxx11::string::append((char *)&local_1d0);
                  psVar22 = puVar19 + 2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar19 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar22) {
                    local_188.field_2._M_allocated_capacity = *psVar22;
                    local_188.field_2._8_8_ = puVar19[3];
                    local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
                  }
                  else {
                    local_188.field_2._M_allocated_capacity = *psVar22;
                    local_188._M_dataplus._M_p = (pointer)*puVar19;
                  }
                  local_188._M_string_length = puVar19[1];
                  *puVar19 = psVar22;
                  puVar19[1] = 0;
                  *(undefined1 *)(puVar19 + 2) = 0;
                  puVar19 = (undefined8 *)std::__cxx11::string::append((char *)&local_188);
                  local_1b0 = (undefined1  [8])local_1a0;
                  psVar22 = puVar19 + 2;
                  if ((size_type *)*puVar19 == psVar22) {
                    local_1a0._0_8_ = *psVar22;
                    local_1a0._8_8_ = puVar19[3];
                  }
                  else {
                    local_1a0._0_8_ = *psVar22;
                    local_1b0 = (undefined1  [8])*puVar19;
                  }
                  local_1a8._M_p = (pointer)puVar19[1];
                  *puVar19 = psVar22;
                  puVar19[1] = 0;
                  *(undefined1 *)(puVar19 + 2) = 0;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_188._M_dataplus._M_p != &local_188.field_2) {
                    operator_delete(local_188._M_dataplus._M_p,
                                    local_188.field_2._M_allocated_capacity + 1);
                  }
                  if (local_1d0 != &local_1c0) {
                    operator_delete(local_1d0,local_1c0 + 1);
                  }
                  if (local_d0 != &local_c0) {
                    operator_delete(local_d0,local_c0 + 1);
                  }
                  if (local_160 != &local_150) {
                    operator_delete(local_160,local_150 + 1);
                  }
                  if (local_120 != &local_110) {
                    operator_delete(local_120,local_110 + 1);
                  }
                  if (local_140 != &local_130) {
                    operator_delete(local_140,local_130 + 1);
                  }
                  Result::Result(local_168,INVALID_MODEL_PARAMETERS,(string *)local_1b0);
                  goto LAB_004e6e23;
                }
              }
              pTVar13 = google::protobuf::internal::RepeatedPtrFieldBase::
                        Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                                  (&pRVar1->super_RepeatedPtrFieldBase,iVar24);
              iVar14 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                       ::find(&local_d8->_M_t,pTVar13);
              if (iVar14._M_node == local_78) {
                uVar3 = pTVar5->rank_;
                pTVar13 = google::protobuf::internal::RepeatedPtrFieldBase::
                          Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                                    (&pRVar1->super_RepeatedPtrFieldBase,iVar24);
                puVar15 = (uint32 *)
                          std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                          ::operator[](local_d8,pTVar13);
                *puVar15 = uVar3;
              }
              else {
                pTVar13 = google::protobuf::internal::RepeatedPtrFieldBase::
                          Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                                    (&pRVar1->super_RepeatedPtrFieldBase,iVar24);
                puVar15 = (uint32 *)
                          std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                          ::operator[](local_d8,pTVar13);
                if (*puVar15 != pTVar5->rank_) {
                  pTVar13 = google::protobuf::internal::RepeatedPtrFieldBase::
                            Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                                      (&pRVar1->super_RepeatedPtrFieldBase,iVar24);
                  pcVar9 = (pTVar13->_M_dataplus)._M_p;
                  local_1d0 = &local_1c0;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_1d0,pcVar9,pcVar9 + pTVar13->_M_string_length);
                  puVar19 = (undefined8 *)
                            std::__cxx11::string::replace((ulong)&local_1d0,0,(char *)0x0,0x60da34);
                  psVar22 = puVar19 + 2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar19 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar22) {
                    local_188.field_2._M_allocated_capacity = *psVar22;
                    local_188.field_2._8_8_ = puVar19[3];
                    local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
                  }
                  else {
                    local_188.field_2._M_allocated_capacity = *psVar22;
                    local_188._M_dataplus._M_p = (pointer)*puVar19;
                  }
                  local_188._M_string_length = puVar19[1];
                  *puVar19 = psVar22;
                  puVar19[1] = 0;
                  *(undefined1 *)(puVar19 + 2) = 0;
                  puVar19 = (undefined8 *)std::__cxx11::string::append((char *)&local_188);
                  local_1b0 = (undefined1  [8])local_1a0;
                  psVar22 = puVar19 + 2;
                  if ((size_type *)*puVar19 == psVar22) {
                    local_1a0._0_8_ = *psVar22;
                    local_1a0._8_8_ = puVar19[3];
                  }
                  else {
                    local_1a0._0_8_ = *psVar22;
                    local_1b0 = (undefined1  [8])*puVar19;
                  }
                  local_1a8._M_p = (pointer)puVar19[1];
                  *puVar19 = psVar22;
                  puVar19[1] = 0;
                  *(undefined1 *)(puVar19 + 2) = 0;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_188._M_dataplus._M_p != &local_188.field_2) {
                    operator_delete(local_188._M_dataplus._M_p,
                                    local_188.field_2._M_allocated_capacity + 1);
                  }
                  if (local_1d0 != &local_1c0) {
                    operator_delete(local_1d0,local_1c0 + 1);
                  }
                  Result::Result(local_168,INVALID_MODEL_PARAMETERS,(string *)local_1b0);
                  goto LAB_004e7013;
                }
              }
              lVar25 = lVar25 + 1;
              lVar12 = lVar12 + -8;
            } while (lVar12 != 0);
            goto LAB_004e5a42;
          }
          psVar8 = (layer->name_).ptr_;
          pcVar9 = (psVar8->_M_dataplus)._M_p;
          local_1d0 = &local_1c0;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1d0,pcVar9,pcVar9 + psVar8->_M_string_length);
          puVar19 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_1d0,0,(char *)0x0,0x6144ab);
          psVar22 = puVar19 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar19 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar22) {
            local_188.field_2._M_allocated_capacity = *psVar22;
            local_188.field_2._8_8_ = puVar19[3];
            local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
          }
          else {
            local_188.field_2._M_allocated_capacity = *psVar22;
            local_188._M_dataplus._M_p = (pointer)*puVar19;
          }
          local_188._M_string_length = puVar19[1];
          *puVar19 = psVar22;
          puVar19[1] = 0;
          *(undefined1 *)(puVar19 + 2) = 0;
          puVar19 = (undefined8 *)std::__cxx11::string::append((char *)&local_188);
          local_1b0 = (undefined1  [8])local_1a0;
          psVar22 = puVar19 + 2;
          if ((size_type *)*puVar19 == psVar22) {
            local_1a0._0_8_ = *psVar22;
            local_1a0._8_8_ = puVar19[3];
          }
          else {
            local_1a0._0_8_ = *psVar22;
            local_1b0 = (undefined1  [8])*puVar19;
          }
          local_1a8._M_p = (pointer)puVar19[1];
          *puVar19 = psVar22;
          puVar19[1] = 0;
          *(undefined1 *)(puVar19 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._M_dataplus._M_p != &local_188.field_2) {
            operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
          }
          if (local_1d0 != &local_1c0) {
            operator_delete(local_1d0,local_1c0 + 1);
          }
          Result::Result(local_168,INVALID_MODEL_PARAMETERS,(string *)local_1b0);
LAB_004e7013:
          if (local_1b0 != (undefined1  [8])local_1a0) {
LAB_004e61c6:
            operator_delete((void *)local_1b0,local_1a0._0_8_ + 1);
          }
          goto LAB_004e61d3;
        }
LAB_004e5a42:
        iVar24 = (layer->outputtensor_).super_RepeatedPtrFieldBase.current_size_;
        if ((long)iVar24 != 0) {
          if ((layer->output_).super_RepeatedPtrFieldBase.current_size_ != iVar24) {
            psVar8 = (layer->name_).ptr_;
            pcVar9 = (psVar8->_M_dataplus)._M_p;
            local_1d0 = &local_1c0;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_1d0,pcVar9,pcVar9 + psVar8->_M_string_length);
            puVar19 = (undefined8 *)
                      std::__cxx11::string::replace((ulong)&local_1d0,0,(char *)0x0,0x6144ab);
            psVar22 = puVar19 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar19 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar22) {
              local_188.field_2._M_allocated_capacity = *psVar22;
              local_188.field_2._8_8_ = puVar19[3];
              local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
            }
            else {
              local_188.field_2._M_allocated_capacity = *psVar22;
              local_188._M_dataplus._M_p = (pointer)*puVar19;
            }
            local_188._M_string_length = puVar19[1];
            *puVar19 = psVar22;
            puVar19[1] = 0;
            *(undefined1 *)(puVar19 + 2) = 0;
            puVar19 = (undefined8 *)std::__cxx11::string::append((char *)&local_188);
            local_1b0 = (undefined1  [8])local_1a0;
            psVar22 = puVar19 + 2;
            if ((size_type *)*puVar19 == psVar22) {
              local_1a0._0_8_ = *psVar22;
              local_1a0._8_8_ = puVar19[3];
            }
            else {
              local_1a0._0_8_ = *psVar22;
              local_1b0 = (undefined1  [8])*puVar19;
            }
            local_1a8._M_p = (pointer)puVar19[1];
            *puVar19 = psVar22;
            puVar19[1] = 0;
            *(undefined1 *)(puVar19 + 2) = 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_188._M_dataplus._M_p != &local_188.field_2) {
              operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_1d0 != &local_1c0) {
              operator_delete(local_1d0,local_1c0 + 1);
            }
            Result::Result(local_168,INVALID_MODEL_PARAMETERS,(string *)local_1b0);
            goto LAB_004e7013;
          }
          pRVar4 = (layer->outputtensor_).super_RepeatedPtrFieldBase.rep_;
          local_a8 = pRVar4->elements;
          if (pRVar4 == (Rep *)0x0) {
            local_a8 = (void **)0x0;
          }
          pRVar1 = &layer->output_;
          lVar12 = (long)iVar24 << 3;
          lVar25 = 0;
          do {
            pTVar5 = (Tensor *)local_a8[lVar25];
            validateTensorMessage((Result *)local_1b0,pTVar5,layer);
            local_100 = (size_type *)local_1b0;
            std::__cxx11::string::operator=((string *)&local_f8,(string *)&local_1a8);
            if (local_1a8._M_p != local_1a0 + 8) {
              operator_delete(local_1a8._M_p,local_1a0._8_8_ + 1);
            }
            bVar11 = Result::good((Result *)&local_100);
            if (!bVar11) goto LAB_004e5cfd;
            iVar24 = (int)lVar25;
            pTVar13 = google::protobuf::internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                                (&pRVar1->super_RepeatedPtrFieldBase,iVar24);
            iVar14 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                     ::find(&local_b0->_M_t,pTVar13);
            if (iVar14._M_node != local_70) {
              uVar3 = pTVar5->rank_;
              pTVar13 = google::protobuf::internal::RepeatedPtrFieldBase::
                        Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                                  (&pRVar1->super_RepeatedPtrFieldBase,iVar24);
              puVar15 = (uint32 *)
                        std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                        ::operator[](local_b0,pTVar13);
              if (uVar3 == *puVar15) goto LAB_004e5b34;
              psVar8 = (layer->name_).ptr_;
              pcVar9 = (psVar8->_M_dataplus)._M_p;
              local_140 = &local_130;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_140,pcVar9,pcVar9 + psVar8->_M_string_length);
              puVar19 = (undefined8 *)
                        std::__cxx11::string::replace((ulong)&local_140,0,(char *)0x0,0x6144ab);
              plVar18 = puVar19 + 2;
              if ((long *)*puVar19 == plVar18) {
                local_110 = *plVar18;
                uStack_108 = puVar19[3];
                local_120 = &local_110;
              }
              else {
                local_110 = *plVar18;
                local_120 = (long *)*puVar19;
              }
              local_118 = puVar19[1];
              *puVar19 = plVar18;
              puVar19[1] = 0;
              *(undefined1 *)(puVar19 + 2) = 0;
              plVar18 = (long *)std::__cxx11::string::append((char *)&local_120);
              puVar21 = (ulong *)(plVar18 + 2);
              if ((ulong *)*plVar18 == puVar21) {
                local_150 = *puVar21;
                lStack_148 = plVar18[3];
                local_160 = &local_150;
              }
              else {
                local_150 = *puVar21;
                local_160 = (ulong *)*plVar18;
              }
              local_158 = plVar18[1];
              *plVar18 = (long)puVar21;
              plVar18[1] = 0;
              *(undefined1 *)(plVar18 + 2) = 0;
              pTVar13 = google::protobuf::internal::RepeatedPtrFieldBase::
                        Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                                  (&(layer->input_).super_RepeatedPtrFieldBase,iVar24);
              pcVar9 = (pTVar13->_M_dataplus)._M_p;
              local_d0 = &local_c0;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_d0,pcVar9,pcVar9 + pTVar13->_M_string_length);
              uVar23 = 0xf;
              if (local_160 != &local_150) {
                uVar23 = local_150;
              }
              if (uVar23 < (ulong)(local_c8 + local_158)) {
                uVar23 = 0xf;
                if (local_d0 != &local_c0) {
                  uVar23 = local_c0;
                }
                if (uVar23 < (ulong)(local_c8 + local_158)) goto LAB_004e6b30;
                puVar19 = (undefined8 *)
                          std::__cxx11::string::replace
                                    ((ulong)&local_d0,0,(char *)0x0,(ulong)local_160);
              }
              else {
LAB_004e6b30:
                puVar19 = (undefined8 *)
                          std::__cxx11::string::_M_append((char *)&local_160,(ulong)local_d0);
              }
              local_1d0 = &local_1c0;
              puVar21 = puVar19 + 2;
              if ((ulong *)*puVar19 == puVar21) {
                local_1c0 = *puVar21;
                uStack_1b8 = puVar19[3];
              }
              else {
                local_1c0 = *puVar21;
                local_1d0 = (ulong *)*puVar19;
              }
              local_1c8 = puVar19[1];
              *puVar19 = puVar21;
              puVar19[1] = 0;
              *(undefined1 *)puVar21 = 0;
              puVar19 = (undefined8 *)std::__cxx11::string::append((char *)&local_1d0);
              psVar22 = puVar19 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar19 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar22) {
                local_188.field_2._M_allocated_capacity = *psVar22;
                local_188.field_2._8_8_ = puVar19[3];
                local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
              }
              else {
                local_188.field_2._M_allocated_capacity = *psVar22;
                local_188._M_dataplus._M_p = (pointer)*puVar19;
              }
              local_188._M_string_length = puVar19[1];
              *puVar19 = psVar22;
              puVar19[1] = 0;
              *(undefined1 *)(puVar19 + 2) = 0;
              puVar19 = (undefined8 *)std::__cxx11::string::append((char *)&local_188);
              local_1b0 = (undefined1  [8])local_1a0;
              psVar22 = puVar19 + 2;
              if ((size_type *)*puVar19 == psVar22) {
                local_1a0._0_8_ = *psVar22;
                local_1a0._8_8_ = puVar19[3];
              }
              else {
                local_1a0._0_8_ = *psVar22;
                local_1b0 = (undefined1  [8])*puVar19;
              }
              local_1a8._M_p = (pointer)puVar19[1];
              *puVar19 = psVar22;
              puVar19[1] = 0;
              *(undefined1 *)(puVar19 + 2) = 0;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_188._M_dataplus._M_p != &local_188.field_2) {
                operator_delete(local_188._M_dataplus._M_p,
                                local_188.field_2._M_allocated_capacity + 1);
              }
              if (local_1d0 != &local_1c0) {
                operator_delete(local_1d0,local_1c0 + 1);
              }
              if (local_d0 != &local_c0) {
                operator_delete(local_d0,local_c0 + 1);
              }
              if (local_160 != &local_150) {
                operator_delete(local_160,local_150 + 1);
              }
              if (local_120 != &local_110) {
                operator_delete(local_120,local_110 + 1);
              }
              if (local_140 != &local_130) {
                operator_delete(local_140,local_130 + 1);
              }
              Result::Result(local_168,INVALID_MODEL_PARAMETERS,(string *)local_1b0);
LAB_004e6e23:
              if (local_1b0 == (undefined1  [8])local_1a0) goto LAB_004e61d3;
              goto LAB_004e61c6;
            }
LAB_004e5b34:
            pTVar13 = google::protobuf::internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                                (&pRVar1->super_RepeatedPtrFieldBase,iVar24);
            iVar14 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                     ::find(&local_d8->_M_t,pTVar13);
            if (iVar14._M_node == local_78) {
              uVar3 = pTVar5->rank_;
              pTVar13 = google::protobuf::internal::RepeatedPtrFieldBase::
                        Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                                  (&pRVar1->super_RepeatedPtrFieldBase,iVar24);
              puVar15 = (uint32 *)
                        std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                        ::operator[](local_d8,pTVar13);
              *puVar15 = uVar3;
              goto LAB_004e5ba0;
            }
            pTVar13 = google::protobuf::internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                                (&pRVar1->super_RepeatedPtrFieldBase,iVar24);
            puVar15 = (uint32 *)
                      std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                      ::operator[](local_d8,pTVar13);
            if (*puVar15 != pTVar5->rank_) {
              pTVar13 = google::protobuf::internal::RepeatedPtrFieldBase::
                        Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                                  (&pRVar1->super_RepeatedPtrFieldBase,iVar24);
              pcVar9 = (pTVar13->_M_dataplus)._M_p;
              local_1d0 = &local_1c0;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_1d0,pcVar9,pcVar9 + pTVar13->_M_string_length);
              puVar19 = (undefined8 *)
                        std::__cxx11::string::replace((ulong)&local_1d0,0,(char *)0x0,0x60da34);
              psVar22 = puVar19 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar19 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar22) {
                local_188.field_2._M_allocated_capacity = *psVar22;
                local_188.field_2._8_8_ = puVar19[3];
                local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
              }
              else {
                local_188.field_2._M_allocated_capacity = *psVar22;
                local_188._M_dataplus._M_p = (pointer)*puVar19;
              }
              local_188._M_string_length = puVar19[1];
              *puVar19 = psVar22;
              puVar19[1] = 0;
              *(undefined1 *)(puVar19 + 2) = 0;
              puVar19 = (undefined8 *)std::__cxx11::string::append((char *)&local_188);
              local_1b0 = (undefined1  [8])local_1a0;
              psVar22 = puVar19 + 2;
              if ((size_type *)*puVar19 == psVar22) {
                local_1a0._0_8_ = *psVar22;
                local_1a0._8_8_ = puVar19[3];
              }
              else {
                local_1a0._0_8_ = *psVar22;
                local_1b0 = (undefined1  [8])*puVar19;
              }
              local_1a8._M_p = (pointer)puVar19[1];
              *puVar19 = psVar22;
              puVar19[1] = 0;
              *(undefined1 *)(puVar19 + 2) = 0;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_188._M_dataplus._M_p != &local_188.field_2) {
                operator_delete(local_188._M_dataplus._M_p,
                                local_188.field_2._M_allocated_capacity + 1);
              }
              if (local_1d0 != &local_1c0) {
                operator_delete(local_1d0,local_1c0 + 1);
              }
              Result::Result(local_168,INVALID_MODEL_PARAMETERS,(string *)local_1b0);
              goto LAB_004e7013;
            }
LAB_004e5ba0:
            lVar25 = lVar25 + 1;
            lVar12 = lVar12 + -8;
          } while (lVar12 != 0);
        }
      }
      validateLayer((Result *)local_1b0,local_80,layer);
      local_100 = (size_type *)local_1b0;
      std::__cxx11::string::operator=((string *)&local_f8,(string *)&local_1a8);
      if (local_1a8._M_p != local_1a0 + 8) {
        operator_delete(local_1a8._M_p,local_1a0._8_8_ + 1);
      }
      bVar11 = Result::good((Result *)&local_100);
      if (!bVar11) goto LAB_004e5cfd;
      pRVar4 = (layer->input_).super_RepeatedPtrFieldBase.rep_;
      ppvVar20 = pRVar4->elements;
      if (pRVar4 == (Rep *)0x0) {
        ppvVar20 = (void **)0x0;
      }
      lVar12 = (long)(layer->input_).super_RepeatedPtrFieldBase.current_size_;
      if (lVar12 != 0) {
        lVar25 = 0;
        do {
          pkVar6 = *(key_type **)((long)ppvVar20 + lVar25);
          iVar16 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                   ::find(&this_00->_M_t,pkVar6);
          if (iVar16._M_node == local_68) {
            psVar8 = (layer->name_).ptr_;
            pcVar9 = (psVar8->_M_dataplus)._M_p;
            local_120 = &local_110;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_120,pcVar9,pcVar9 + psVar8->_M_string_length);
            plVar18 = (long *)std::__cxx11::string::replace
                                        ((ulong)&local_120,0,(char *)0x0,0x6144ab);
            puVar21 = (ulong *)(plVar18 + 2);
            if ((ulong *)*plVar18 == puVar21) {
              local_150 = *puVar21;
              lStack_148 = plVar18[3];
              local_160 = &local_150;
            }
            else {
              local_150 = *puVar21;
              local_160 = (ulong *)*plVar18;
            }
            local_158 = plVar18[1];
            *plVar18 = (long)puVar21;
            plVar18[1] = 0;
            *(undefined1 *)(plVar18 + 2) = 0;
            puVar19 = (undefined8 *)std::__cxx11::string::append((char *)&local_160);
            puVar21 = puVar19 + 2;
            if ((ulong *)*puVar19 == puVar21) {
              local_1c0 = *puVar21;
              uStack_1b8 = puVar19[3];
              local_1d0 = &local_1c0;
            }
            else {
              local_1c0 = *puVar21;
              local_1d0 = (ulong *)*puVar19;
            }
            local_1c8 = puVar19[1];
            *puVar19 = puVar21;
            puVar19[1] = 0;
            *(undefined1 *)(puVar19 + 2) = 0;
            pcVar9 = (pkVar6->_M_dataplus)._M_p;
            local_140 = &local_130;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_140,pcVar9,pcVar9 + pkVar6->_M_string_length);
            uVar23 = 0xf;
            if (local_1d0 != &local_1c0) {
              uVar23 = local_1c0;
            }
            if (uVar23 < (ulong)(local_138 + local_1c8)) {
              uVar23 = 0xf;
              if (local_140 != &local_130) {
                uVar23 = local_130;
              }
              if (uVar23 < (ulong)(local_138 + local_1c8)) goto LAB_004e5f77;
              puVar19 = (undefined8 *)
                        std::__cxx11::string::replace
                                  ((ulong)&local_140,0,(char *)0x0,(ulong)local_1d0);
            }
            else {
LAB_004e5f77:
              puVar19 = (undefined8 *)
                        std::__cxx11::string::_M_append((char *)&local_1d0,(ulong)local_140);
            }
            local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
            psVar22 = puVar19 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar19 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar22) {
              local_188.field_2._M_allocated_capacity = *psVar22;
              local_188.field_2._8_8_ = puVar19[3];
            }
            else {
              local_188.field_2._M_allocated_capacity = *psVar22;
              local_188._M_dataplus._M_p = (pointer)*puVar19;
            }
            local_188._M_string_length = puVar19[1];
            *puVar19 = psVar22;
            puVar19[1] = 0;
            *(undefined1 *)psVar22 = 0;
            plVar18 = (long *)std::__cxx11::string::append((char *)&local_188);
            psVar22 = (size_type *)(plVar18 + 2);
            if ((size_type *)*plVar18 == psVar22) {
              local_1a0._0_8_ = *psVar22;
              local_1a0._8_8_ = plVar18[3];
              local_1b0 = (undefined1  [8])local_1a0;
            }
            else {
              local_1a0._0_8_ = *psVar22;
              local_1b0 = (undefined1  [8])*plVar18;
            }
            local_1a8._M_p = (pointer)plVar18[1];
            *plVar18 = (long)psVar22;
            plVar18[1] = 0;
            *(undefined1 *)(plVar18 + 2) = 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_188._M_dataplus._M_p != &local_188.field_2) {
              operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_140 != &local_130) {
              operator_delete(local_140,local_130 + 1);
            }
            if (local_1d0 != &local_1c0) {
              operator_delete(local_1d0,local_1c0 + 1);
            }
            if (local_160 != &local_150) {
              operator_delete(local_160,local_150 + 1);
            }
            if (local_120 != &local_110) {
              operator_delete(local_120,local_110 + 1);
            }
            Result::Result(local_168,INVALID_MODEL_PARAMETERS,(string *)local_1b0);
            if (local_1b0 == (undefined1  [8])local_1a0) goto LAB_004e61d3;
            goto LAB_004e61c6;
          }
          lVar25 = lVar25 + 8;
        } while (lVar12 * 8 != lVar25);
      }
      pRVar4 = (layer->output_).super_RepeatedPtrFieldBase.rep_;
      ppvVar20 = pRVar4->elements;
      if (pRVar4 == (Rep *)0x0) {
        ppvVar20 = (void **)0x0;
      }
      lVar12 = (long)(layer->output_).super_RepeatedPtrFieldBase.current_size_;
      if (lVar12 != 0) {
        lVar25 = 0;
        do {
          pkVar6 = *(key_type **)((long)ppvVar20 + lVar25);
          iVar16 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                   ::find(&this_00->_M_t,pkVar6);
          if ((iVar16._M_node != local_68) && (layer->_oneof_case_[0] != 600)) {
            pmVar17 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                      ::operator[](this_00,pkVar6);
            p_Var7 = (pmVar17->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
            local_1b0 = (undefined1  [8])local_1a0;
            lVar12 = *(long *)(p_Var7 + 1);
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_1b0,lVar12,(long)&(p_Var7[1]._M_parent)->_M_color + lVar12);
            psVar8 = (layer->name_).ptr_;
            pcVar9 = (psVar8->_M_dataplus)._M_p;
            local_50[0] = local_40;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_50,pcVar9,pcVar9 + psVar8->_M_string_length);
            plVar18 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x6144ab);
            puVar21 = (ulong *)(plVar18 + 2);
            if ((ulong *)*plVar18 == puVar21) {
              local_c0 = *puVar21;
              lStack_b8 = plVar18[3];
              local_d0 = &local_c0;
            }
            else {
              local_c0 = *puVar21;
              local_d0 = (ulong *)*plVar18;
            }
            local_c8 = plVar18[1];
            *plVar18 = (long)puVar21;
            plVar18[1] = 0;
            *(undefined1 *)(plVar18 + 2) = 0;
            plVar18 = (long *)std::__cxx11::string::append((char *)&local_d0);
            puVar21 = (ulong *)(plVar18 + 2);
            if ((ulong *)*plVar18 == puVar21) {
              local_130 = *puVar21;
              uStack_128 = (undefined4)plVar18[3];
              uStack_124 = *(undefined4 *)((long)plVar18 + 0x1c);
              local_140 = &local_130;
            }
            else {
              local_130 = *puVar21;
              local_140 = (ulong *)*plVar18;
            }
            local_138 = plVar18[1];
            *plVar18 = (long)puVar21;
            plVar18[1] = 0;
            *(undefined1 *)(plVar18 + 2) = 0;
            local_a0 = local_90;
            pcVar9 = (pkVar6->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_a0,pcVar9,pcVar9 + pkVar6->_M_string_length);
            uVar23 = 0xf;
            if (local_140 != &local_130) {
              uVar23 = local_130;
            }
            if (uVar23 < (ulong)(local_98 + local_138)) {
              uVar23 = 0xf;
              if (local_a0 != local_90) {
                uVar23 = local_90[0];
              }
              if (uVar23 < (ulong)(local_98 + local_138)) goto LAB_004e6315;
              puVar19 = (undefined8 *)
                        std::__cxx11::string::replace
                                  ((ulong)&local_a0,0,(char *)0x0,(ulong)local_140);
            }
            else {
LAB_004e6315:
              puVar19 = (undefined8 *)
                        std::__cxx11::string::_M_append((char *)&local_140,(ulong)local_a0);
            }
            local_120 = &local_110;
            plVar18 = puVar19 + 2;
            if ((long *)*puVar19 == plVar18) {
              local_110 = *plVar18;
              uStack_108 = puVar19[3];
            }
            else {
              local_110 = *plVar18;
              local_120 = (long *)*puVar19;
            }
            local_118 = puVar19[1];
            *puVar19 = plVar18;
            puVar19[1] = 0;
            *(undefined1 *)plVar18 = 0;
            plVar18 = (long *)std::__cxx11::string::append((char *)&local_120);
            puVar21 = (ulong *)(plVar18 + 2);
            if ((ulong *)*plVar18 == puVar21) {
              local_150 = *puVar21;
              lStack_148 = plVar18[3];
              local_160 = &local_150;
            }
            else {
              local_150 = *puVar21;
              local_160 = (ulong *)*plVar18;
            }
            local_158 = plVar18[1];
            *plVar18 = (long)puVar21;
            plVar18[1] = 0;
            *(undefined1 *)(plVar18 + 2) = 0;
            puVar19 = (undefined8 *)
                      std::__cxx11::string::_M_append((char *)&local_160,(ulong)local_1b0);
            puVar21 = puVar19 + 2;
            if ((ulong *)*puVar19 == puVar21) {
              local_1c0 = *puVar21;
              uStack_1b8 = puVar19[3];
              local_1d0 = &local_1c0;
            }
            else {
              local_1c0 = *puVar21;
              local_1d0 = (ulong *)*puVar19;
            }
            local_1c8 = puVar19[1];
            *puVar19 = puVar21;
            puVar19[1] = 0;
            *(undefined1 *)(puVar19 + 2) = 0;
            puVar19 = (undefined8 *)std::__cxx11::string::append((char *)&local_1d0);
            psVar22 = puVar19 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar19 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar22) {
              local_188.field_2._M_allocated_capacity = *psVar22;
              local_188.field_2._8_8_ = puVar19[3];
              local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
            }
            else {
              local_188.field_2._M_allocated_capacity = *psVar22;
              local_188._M_dataplus._M_p = (pointer)*puVar19;
            }
            local_188._M_string_length = puVar19[1];
            *puVar19 = psVar22;
            puVar19[1] = 0;
            *(undefined1 *)(puVar19 + 2) = 0;
            if (local_1d0 != &local_1c0) {
              operator_delete(local_1d0,local_1c0 + 1);
            }
            if (local_160 != &local_150) {
              operator_delete(local_160,local_150 + 1);
            }
            if (local_120 != &local_110) {
              operator_delete(local_120,local_110 + 1);
            }
            if (local_a0 != local_90) {
              operator_delete(local_a0,local_90[0] + 1);
            }
            if (local_140 != &local_130) {
              operator_delete(local_140,local_130 + 1);
            }
            if (local_d0 != &local_c0) {
              operator_delete(local_d0,local_c0 + 1);
            }
            if (local_50[0] != local_40) {
              operator_delete(local_50[0],local_40[0] + 1);
            }
            Result::Result(local_168,INVALID_MODEL_PARAMETERS,&local_188);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_188._M_dataplus._M_p != &local_188.field_2) {
              operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_1b0 == (undefined1  [8])local_1a0) goto LAB_004e61d3;
            goto LAB_004e61c6;
          }
          this_01 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                     *)std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                       ::operator[](this_00,pkVar6);
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>(this_01,(layer->name_).ptr_);
          lVar25 = lVar25 + 8;
        } while (lVar12 * 8 != lVar25);
      }
      ppvVar20 = local_58 + 1;
    } while (ppvVar20 != local_60);
  }
  Result::Result(local_168);
LAB_004e61d3:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_p != &local_e8) {
    operator_delete(local_f8._M_p,
                    CONCAT71(local_e8._M_allocated_capacity._1_7_,local_e8._M_local_buf[0]) + 1);
  }
  return local_168;
}

Assistant:

Result NeuralNetworkSpecValidator::validateNeuralNetwork(const T& nn) {
    
    Result r;
    
    // Loop over the layers
    // For each layer, validate the following:
    // 1. inputtensor/outputtensor message, rank compatibilty with Model input/output ranks
    // 2. Check rank consistency across the network for all blobs: ranks are not allowed to change for the same blob
    // 3. Call layer specific validation function
    // 4. check that layer's inputs are already present in "availableBlobs" set
    // 5. check that layer's outputs are NOT already present in "availableBlobs" set
    // 6. Add the layer's outputs to the "availableBlobs" set
    for (const auto& layer : nn.layers()) {
        
        if (!r.good()) {
            return r;
        }
        
        // check for inputtensor message valididty
        if (ndArrayInterpretation) {
            if (layer.inputtensor_size() != 0) {
                if (layer.input_size() != layer.inputtensor_size()) {
                    std::string err = "Layer '" + std::string(layer.name()) + "''s input and inputTensors have different lengths";
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                }
                int idx = 0;
                for (const auto& tensor: layer.inputtensor()) {
                    r = validateTensorMessage(tensor, layer);
                    if (!r.good()) {
                        return r;
                    }
                    if (!(ModelIOBlobNameToRank.find(layer.input(idx)) == ModelIOBlobNameToRank.end())) {
                        if (static_cast<int>(tensor.rank()) != ModelIOBlobNameToRank[layer.input(idx)]) {
                            std::string err = "Layer '" + std::string(layer.name()) + "''s input '" + std::string(layer.input(idx)) + \
                            "' is also an input to the model. However, for this tensor the rank provided in the layer description" + \
                            " does not match the one provided in the model description";
                            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                        }
                    }
                    // verify rank consistency of intermediate blobs:
                    // if a blob is both an input and output to layers, the rank specified at both places must match
                    if (blobNameToRank.find(layer.input(idx)) == blobNameToRank.end()) {
                        blobNameToRank[layer.input(idx)] = (int)tensor.rank();
                    } else {
                        if (blobNameToRank[layer.input(idx)] != (int)tensor.rank()) {
                            std::string err = "Inconsistent rank for the blob named '" + std::string(layer.input(idx)) + "'.";
                            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                        }
                    }
                    idx++;
                }
            }
            if (layer.outputtensor_size() != 0) {
                if (layer.output_size() != layer.outputtensor_size()) {
                    std::string err = "Layer '" + std::string(layer.name()) + "''s output and \"outputTensors\" property have different lengths";
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                }
                int idx = 0;
                for (const auto& tensor: layer.outputtensor()) {
                    r = validateTensorMessage(tensor, layer);
                    if (!r.good()) {
                        return r;
                    }
                    if (!(ModelIOBlobNameToRank.find(layer.output(idx)) == ModelIOBlobNameToRank.end())) {
                        if (static_cast<int>(tensor.rank()) != ModelIOBlobNameToRank[layer.output(idx)]) {
                            std::string err = "Layer '" + std::string(layer.name()) + "''s output '" + std::string(layer.input(idx)) + \
                            "' is also an output of the model. However, for this tensor the rank provided in the layer description" + \
                            " does not match the one provided in the model description";
                            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                        }
                    }
                    // verify rank consistency of intermediate blobs:
                    // if a blob is both an input and output to layers, the rank specified at both places must match
                    if (blobNameToRank.find(layer.output(idx)) == blobNameToRank.end()) {
                        blobNameToRank[layer.output(idx)] = (int)tensor.rank();
                    } else {
                        if (blobNameToRank[layer.output(idx)] != (int)tensor.rank()) {
                            std::string err = "Inconsistent rank for the blob named '" + std::string(layer.output(idx)) + "'.";
                            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                        }
                    }
                    idx++;
                }
            }
        } // inputtensor, outputtensor validity end
        
        // First, we check the layer for internal correctness
        // this calls layer wise function
        r = validateLayer(layer);
        
        if (!r.good()) {
            return r;
        }
        
        // Check for topological defects: the layer's input must have been produced by a blob we have
        // already seen.
        for (const auto& input: layer.input()) {
            if (blobs.find(input) == blobs.end()) {
                std::string err = "Layer '" + std::string(layer.name()) + "' consumes an input named '"
                + std::string(input) + "' which is not present in this network.";
                return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
            }
        }
        
        // Check for topological defects: check that the same output isn't being produced in two different places.
        // unless its the "copy" layer
        for (const auto& output: layer.output()) {
            if (blobs.find(output) != blobs.end()) {
                if (layer.layer_case() != Specification::NeuralNetworkLayer::LayerCase::kCopy) {
                    std::string layer_name = *(blobs[output].begin());
                    std::string err = "Layer '" + std::string(layer.name()) + "' produces an output named '"
                    + std::string(output) + "' which is also an output produced by the layer '"
                    + layer_name + "'.";
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                }
            }
            blobs[output].insert(layer.name());
        }
    } // loop over layers
    
    return Result();
}